

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O0

int archive_compressor_xz_options(archive_write_filter *f,char *key,char *value)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  private_data_conflict6 *data;
  char *value_local;
  char *key_local;
  archive_write_filter *f_local;
  
  piVar1 = (int *)f->data;
  iVar2 = strcmp(key,"compression-level");
  if (iVar2 == 0) {
    if ((((value == (char *)0x0) || (*value < '0')) || ('9' < *value)) || (value[1] != '\0')) {
      f_local._4_4_ = -0x14;
    }
    else {
      *piVar1 = *value + -0x30;
      if (6 < *piVar1) {
        *piVar1 = 6;
      }
      f_local._4_4_ = 0;
    }
  }
  else {
    iVar2 = strcmp(key,"threads");
    if (iVar2 == 0) {
      if (value == (char *)0x0) {
        f_local._4_4_ = -0x14;
      }
      else {
        uVar3 = strtoul(value,(char **)0x0,10);
        piVar1[1] = (int)uVar3;
        if ((piVar1[1] == 0) && (piVar4 = __errno_location(), *piVar4 != 0)) {
          piVar1[1] = 1;
          return -0x14;
        }
        if (piVar1[1] == 0) {
          piVar1[1] = 1;
        }
        f_local._4_4_ = 0;
      }
    }
    else {
      f_local._4_4_ = -0x14;
    }
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_xz_options(struct archive_write_filter *f,
    const char *key, const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		if (value == NULL || !(value[0] >= '0' && value[0] <= '9') ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);
		data->compression_level = value[0] - '0';
		if (data->compression_level > 6)
			data->compression_level = 6;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "threads") == 0) {
		if (value == NULL)
			return (ARCHIVE_WARN);
		data->threads = (int)strtoul(value, NULL, 10);
		if (data->threads == 0 && errno != 0) {
			data->threads = 1;
			return (ARCHIVE_WARN);
		}
		if (data->threads == 0) {
#ifdef HAVE_LZMA_STREAM_ENCODER_MT
			data->threads = lzma_cputhreads();
#else
			data->threads = 1;
#endif
		}
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}